

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_descriptor_wpkh(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  
  if (parent != (miniscript_node_t *)0x0) {
    if (parent->info == (miniscript_item_t *)0x0) {
      return -2;
    }
    if ((parent->info->kind & 1) != 0) {
      return -2;
    }
  }
  iVar5 = 0;
  pmVar1 = node->child;
  for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
    iVar5 = iVar5 + 1;
  }
  iVar4 = -2;
  if (((iVar5 == node->info->inner_num) && (pmVar1->info == (miniscript_item_t *)0x0)) &&
     ((pmVar1->kind & 0x20) != 0)) {
    for (; parent != (miniscript_node_t *)0x0; parent = parent->parent) {
      if (parent->kind == 0x20002) {
        return -2;
      }
    }
    _Var3 = has_uncompressed_key_by_child(node);
    iVar4 = (uint)!_Var3 * 2 + -2;
  }
  return iVar4;
}

Assistant:

static int verify_descriptor_wpkh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *parent_item = parent;
    if (parent && (!parent->info || (parent->info->kind & DESCRIPTOR_KIND_MINISCRIPT)))
        return WALLY_EINVAL;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        ((node->child->kind & DESCRIPTOR_KIND_KEY) != DESCRIPTOR_KIND_KEY))
        return WALLY_EINVAL;

    while (parent_item != NULL) {
        if (parent_item->kind == DESCRIPTOR_KIND_DESCRIPTOR_WSH)
            return WALLY_EINVAL;
        parent_item = parent_item->parent;
    }

    if (has_uncompressed_key_by_child(node))
        return WALLY_EINVAL;

    return WALLY_OK;
}